

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::notify_delete(CVmObjDict *this,int param_2)

{
  CVmHashTable *pCVar1;
  vmdict_TrieNode *pvVar2;
  vm_dict_ext *pvVar3;
  CVmVarHeap *pCVar4;
  undefined4 in_ESI;
  CVmObjDict *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_RDI->super_CVmObject).ext_ != (char *)0x0) {
    pvVar3 = get_ext(in_RDI);
    if (pvVar3->hashtab_ != (CVmHashTable *)0x0) {
      pvVar3 = get_ext(in_RDI);
      pCVar1 = pvVar3->hashtab_;
      if (pCVar1 != (CVmHashTable *)0x0) {
        CVmHashTable::~CVmHashTable((CVmHashTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        operator_delete(pCVar1,0x20);
      }
    }
    pvVar3 = get_ext(in_RDI);
    if (pvVar3->trie_ != (vmdict_TrieNode *)0x0) {
      pvVar3 = get_ext(in_RDI);
      pvVar2 = pvVar3->trie_;
      if (pvVar2 != (vmdict_TrieNode *)0x0) {
        vmdict_TrieNode::~vmdict_TrieNode
                  ((vmdict_TrieNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        operator_delete(pvVar2,0x18);
      }
    }
    pCVar4 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar4->_vptr_CVmVarHeap[6])(pCVar4,(in_RDI->super_CVmObject).ext_);
  }
  return;
}

Assistant:

void CVmObjDict::notify_delete(VMG_ int /*in_root_set*/)
{
    /* free our additional data */
    if (ext_ != 0)
    {
        /* free our hash table */
        if (get_ext()->hashtab_ != 0)
            delete get_ext()->hashtab_;

        /* free our Trie */
        if (get_ext()->trie_ != 0)
            delete get_ext()->trie_;

        /* free the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}